

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torturethread.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  SDL_Thread *pSVar3;
  undefined8 uVar4;
  long lVar5;
  SDL_Thread *threads [10];
  
  iVar2 = SDL_Init(0);
  pFVar1 = _stderr;
  if (iVar2 < 0) {
    uVar4 = SDL_GetError();
    fprintf(pFVar1,"Couldn\'t initialize SDL: %s\n",uVar4);
    iVar2 = 1;
  }
  else {
    lVar5 = 0;
    signal(0xb,(__sighandler_t)0x0);
    while (lVar5 != 10) {
      time_for_threads_to_die[lVar5] = '\0';
      pSVar3 = (SDL_Thread *)SDL_CreateThread(ThreadFunc);
      pFVar1 = _stderr;
      threads[lVar5] = pSVar3;
      lVar5 = lVar5 + 1;
      if (pSVar3 == (SDL_Thread *)0x0) {
        uVar4 = SDL_GetError();
        fprintf(pFVar1,"Couldn\'t create thread: %s\n",uVar4);
        SDL_Quit();
        exit(1);
      }
    }
    for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
      time_for_threads_to_die[lVar5] = '\x01';
    }
    for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
      SDL_WaitThread(threads[lVar5],0);
    }
    SDL_Quit();
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Thread *threads[NUMTHREADS];
	int i;

	/* Load the SDL library */
	if ( SDL_Init(0) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return(1);
	}

	signal(SIGSEGV, SIG_DFL);
	for(i = 0; i < NUMTHREADS; i++) {
		time_for_threads_to_die[i] = 0;
		threads[i] = SDL_CreateThread(ThreadFunc, (void *)(uintptr_t)i);
	
		if ( threads[i] == NULL ) {
			fprintf(stderr,
			"Couldn't create thread: %s\n", SDL_GetError());
			quit(1);
		}
	}

	for(i = 0; i < NUMTHREADS; i++) {
		time_for_threads_to_die[i] = 1;
	}

	for(i = 0; i < NUMTHREADS; i++) {
		SDL_WaitThread(threads[i], NULL);
	}
	SDL_Quit();
	return(0);
}